

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O2

Curl_dns_entry *
dnscache_add_addr(Curl_easy *data,Curl_dnscache *dnscache,Curl_addrinfo *addr,char *hostname,
                 size_t hostlen,int port,_Bool permanent)

{
  curl_trc_feat *pcVar1;
  undefined8 uVar2;
  CURLcode CVar3;
  undefined8 *puVar4;
  ulong uVar5;
  uchar *rnd;
  Curl_dns_entry *dns;
  size_t sVar6;
  time_t tVar7;
  time_t tVar8;
  Curl_dns_entry *pCVar9;
  Curl_addrinfo *pCVar10;
  size_t sVar11;
  ulong uVar12;
  ulong uVar13;
  size_t num;
  Curl_addrinfo *local_158;
  char entry_id [262];
  
  uVar5 = *(ulong *)&(data->set).field_0x894;
  sVar6 = hostlen;
  if ((uVar5 >> 0x2e & 1) != 0) {
    sVar11 = 0;
    num = 0;
    uVar13 = 0;
    for (pCVar10 = addr; pCVar10 != (Curl_addrinfo *)0x0; pCVar10 = pCVar10->ai_next) {
      uVar13 = uVar13 + 1;
      num = num + 4;
      sVar11 = sVar11 + 8;
    }
    if (1 < (uint)uVar13) {
      if ((((uint)uVar5 >> 0x1e & 1) != 0 && data != (Curl_easy *)0x0) &&
         ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level))))
      {
        Curl_infof(data,"Shuffling %i addresses",uVar13 & 0xffffffff);
      }
      puVar4 = (undefined8 *)(*Curl_cmalloc)(sVar11);
      local_158 = addr;
      if (puVar4 == (undefined8 *)0x0) goto LAB_0012ff11;
      *puVar4 = addr;
      for (uVar5 = 1; uVar5 < uVar13; uVar5 = uVar5 + 1) {
        puVar4[uVar5] = *(undefined8 *)(puVar4[uVar5 - 1] + 0x28);
      }
      rnd = (uchar *)(*Curl_cmalloc)(num);
      if (rnd != (uchar *)0x0) {
        CVar3 = Curl_rand_bytes(data,rnd,num);
        if (CVar3 == CURLE_OK) {
          uVar12 = uVar13 & 0xffffffff;
          for (uVar5 = uVar13 - 1 & 0xffffffff; 0 < (int)uVar5; uVar5 = uVar5 - 1) {
            uVar2 = puVar4[(ulong)*(uint *)(rnd + uVar5 * 4) % uVar12];
            puVar4[(ulong)*(uint *)(rnd + uVar5 * 4) % uVar12] = puVar4[uVar5];
            puVar4[uVar5] = uVar2;
            uVar12 = (ulong)((int)uVar12 - 1);
          }
          for (uVar5 = 1; uVar5 < uVar13; uVar5 = uVar5 + 1) {
            *(undefined8 *)(puVar4[uVar5 - 1] + 0x28) = puVar4[uVar5];
          }
          *(undefined8 *)(puVar4[uVar13 - 1] + 0x28) = 0;
          local_158 = (Curl_addrinfo *)*puVar4;
        }
        (*Curl_cfree)(rnd);
      }
      (*Curl_cfree)(puVar4);
      addr = local_158;
      if (rnd == (uchar *)0x0) goto LAB_0012ff11;
    }
  }
  if (hostlen == 0) {
    hostlen = strlen(hostname);
  }
  dns = (Curl_dns_entry *)(*Curl_ccalloc)(1,hostlen + 0x20);
  local_158 = addr;
  if (dns != (Curl_dns_entry *)0x0) {
    sVar6 = create_dnscache_id(hostname,hostlen,port,entry_id,sVar6);
    dns->refcount = 1;
    dns->addr = addr;
    if (permanent) {
      tVar8 = 0;
    }
    else {
      tVar7 = time((time_t *)0x0);
      tVar8 = tVar7 + (ulong)(tVar7 == 0);
    }
    dns->timestamp = tVar8;
    dns->hostport = port;
    if (hostlen != 0) {
      memcpy(dns->hostname,hostname,hostlen);
    }
    pCVar9 = (Curl_dns_entry *)Curl_hash_add(&dnscache->entries,entry_id,sVar6 + 1,dns);
    if (pCVar9 == (Curl_dns_entry *)0x0) {
      dnscache_entry_free(dns);
      return (Curl_dns_entry *)0x0;
    }
    pCVar9->refcount = pCVar9->refcount + 1;
    return pCVar9;
  }
LAB_0012ff11:
  Curl_freeaddrinfo(local_158);
  return (Curl_dns_entry *)0x0;
}

Assistant:

static struct Curl_dns_entry *
dnscache_add_addr(struct Curl_easy *data,
                  struct Curl_dnscache *dnscache,
                  struct Curl_addrinfo *addr,
                  const char *hostname,
                  size_t hostlen, /* length or zero */
                  int port,
                  bool permanent)
{
  char entry_id[MAX_HOSTCACHE_LEN];
  size_t entry_len;
  struct Curl_dns_entry *dns;
  struct Curl_dns_entry *dns2;

#ifndef CURL_DISABLE_SHUFFLE_DNS
  /* shuffle addresses if requested */
  if(data->set.dns_shuffle_addresses) {
    CURLcode result = Curl_shuffle_addr(data, &addr);
    if(result) {
      Curl_freeaddrinfo(addr);
      return NULL;
    }
  }
#endif
  if(!hostlen)
    hostlen = strlen(hostname);

  /* Create a new cache entry */
  dns = calloc(1, sizeof(struct Curl_dns_entry) + hostlen);
  if(!dns) {
    Curl_freeaddrinfo(addr);
    return NULL;
  }

  /* Create an entry id, based upon the hostname and port */
  entry_len = create_dnscache_id(hostname, hostlen, port,
                                 entry_id, sizeof(entry_id));

  dns->refcount = 1; /* the cache has the first reference */
  dns->addr = addr; /* this is the address(es) */
  if(permanent)
    dns->timestamp = 0; /* an entry that never goes stale */
  else {
    dns->timestamp = time(NULL);
    if(dns->timestamp == 0)
      dns->timestamp = 1;
  }
  dns->hostport = port;
  if(hostlen)
    memcpy(dns->hostname, hostname, hostlen);

  /* Store the resolved data in our DNS cache. */
  dns2 = Curl_hash_add(&dnscache->entries, entry_id, entry_len + 1,
                       (void *)dns);
  if(!dns2) {
    dnscache_entry_free(dns);
    return NULL;
  }

  dns = dns2;
  dns->refcount++;         /* mark entry as in-use */
  return dns;
}